

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

Time __thiscall helics::FederateState::nextValueTime(FederateState *this)

{
  pointer puVar1;
  Time TVar2;
  Time TVar3;
  long lVar4;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *inp;
  pointer puVar5;
  shared_handle local_38;
  
  gmlc::libguarded::
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::lock_shared(&local_38,&(this->interfaceInformation).inputs);
  puVar1 = ((local_38.data)->dataStorage).
           super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = 0x7fffffffffffffff;
  for (puVar5 = ((local_38.data)->dataStorage).
                super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    TVar2 = InputInfo::nextValueTime
                      ((puVar5->_M_t).
                       super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                       .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl);
    TVar3 = TVar2;
    if (lVar4 <= TVar2.internalTimeCode) {
      TVar3.internalTimeCode = lVar4;
    }
    if ((this->time_granted).internalTimeCode <= TVar2.internalTimeCode) {
      lVar4 = TVar3.internalTimeCode;
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_38.m_handle_lock);
  return (Time)lVar4;
}

Assistant:

Time FederateState::nextValueTime() const
{
    auto firstValueTime = Time::maxVal();
    for (const auto& inp : interfaceInformation.getInputs()) {
        auto nvt = inp->nextValueTime();
        if (nvt >= time_granted) {
            if (nvt < firstValueTime) {
                firstValueTime = nvt;
            }
        }
    }
    return firstValueTime;
}